

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O1

void __thiscall libtorrent::portmap_log_alert::~portmap_log_alert(portmap_log_alert *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  pcVar2 = (this->msg)._M_dataplus._M_p;
  paVar1 = &(this->msg).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT portmap_log_alert final : alert
	{
		// internal
		portmap_log_alert(aux::stack_allocator& alloc, portmap_transport t, const char* m);

		TORRENT_DEFINE_ALERT(portmap_log_alert, 52)

		static constexpr alert_category_t static_category = alert_category::port_mapping_log;
		std::string message() const override;

		portmap_transport const map_transport;

		// the message associated with this log line
		char const* log_message() const;

	private:

		std::reference_wrapper<aux::stack_allocator const> m_alloc;

		aux::allocation_slot m_log_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		int const TORRENT_DEPRECATED_MEMBER map_type;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif

	}